

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

bool __thiscall
Js::JITPageAddrToFuncRangeCache::IsNativeAddr(JITPageAddrToFuncRangeCache *this,void *address)

{
  long lVar1;
  void *pvVar2;
  LargeJITFuncAddrToSizeMap *pLVar3;
  Type pSVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  void *local_30;
  void *pageAddr;
  AutoCriticalSection autocs;
  RangeMap *rangeMap;
  
  pageAddr = cs;
  CCLock::Enter((CCLock *)cs);
  autocs.cs = (CriticalSection *)0x0;
  local_30 = (void *)(ulong)((uint)address & 0xfffff000);
  if ((this->jitPageAddrToFuncRangeMap != (JITPageAddrToFuncRangeMap *)0x0) &&
     (bVar5 = JsUtil::
              BaseDictionary<void*,JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::TryGetValue<void*>
                        ((BaseDictionary<void*,JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)this->jitPageAddrToFuncRangeMap,&local_30,
                         (BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                          **)&autocs), bVar5)) {
    lVar1 = *(long *)(((autocs.cs)->super_CCLock).mutexPtr + 8);
    for (uVar8 = 0; uVar8 != *(uint *)(((autocs.cs)->super_CCLock).mutexPtr + 0x1c);
        uVar8 = uVar8 + 1) {
      iVar9 = *(int *)(*(long *)((autocs.cs)->super_CCLock).mutexPtr + uVar8 * 4);
      if (iVar9 != -1) {
        while (iVar9 != -1) {
          lVar11 = (long)iVar9 * 0x10;
          iVar9 = *(int *)(lVar1 + 4 + lVar11);
          pvVar2 = *(void **)(lVar1 + 8 + lVar11);
          if ((pvVar2 <= address) &&
             (address < (void *)((ulong)*(uint *)(lVar1 + lVar11) + (long)pvVar2))) {
            bVar5 = true;
            goto LAB_006f43b8;
          }
        }
      }
    }
  }
  pLVar3 = this->largeJitFuncToSizeMap;
  if (pLVar3 == (LargeJITFuncAddrToSizeMap *)0x0) {
    bVar5 = false;
  }
  else {
    uVar8 = (ulong)pLVar3->bucketCount;
    pSVar4 = pLVar3->entries;
    for (uVar6 = 0; uVar7 = uVar8, uVar6 != uVar8; uVar6 = uVar6 + 1) {
      iVar9 = pLVar3->buckets[uVar6];
      if (pLVar3->buckets[uVar6] != -1) {
        while (iVar10 = iVar9, iVar10 != -1) {
          iVar9 = pSVar4[iVar10].
                  super_DefaultHashedEntry<void_*,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<void_*,_unsigned_int>.
                  super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_unsigned_int>_>
                  .super_KeyValueEntryDataLayout2<void_*,_unsigned_int>.next;
          pvVar2 = pSVar4[iVar10].
                   super_DefaultHashedEntry<void_*,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .super_KeyValueEntry<void_*,_unsigned_int>.
                   super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_unsigned_int>_>
                   .super_KeyValueEntryDataLayout2<void_*,_unsigned_int>.key;
          if ((pvVar2 <= address) &&
             (uVar7 = uVar6,
             address < (void *)((ulong)pSVar4[iVar10].
                                       super_DefaultHashedEntry<void_*,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                       .super_KeyValueEntry<void_*,_unsigned_int>.
                                       super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_unsigned_int>_>
                                       .super_KeyValueEntryDataLayout2<void_*,_unsigned_int>.value +
                               (long)pvVar2))) goto LAB_006f43b2;
        }
      }
    }
LAB_006f43b2:
    bVar5 = uVar7 < uVar8;
  }
LAB_006f43b8:
  AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&pageAddr);
  return bVar5;
}

Assistant:

bool JITPageAddrToFuncRangeCache::IsNativeAddr(void * address)
    {
        AutoCriticalSection autocs(GetCriticalSection());

        void * pageAddr = GetPageAddr(address);
        RangeMap * rangeMap = nullptr;
        if (jitPageAddrToFuncRangeMap && jitPageAddrToFuncRangeMap->TryGetValue(pageAddr, &rangeMap))
        {
            if (rangeMap->MapUntil(
                [&](void* key, uint value) {
                return (key <= address && (uintptr_t)address < ((uintptr_t)key + value));
            }))
            {
                return true;
            }
        }

        return largeJitFuncToSizeMap && largeJitFuncToSizeMap->MapUntil(
            [&](void *key, uint value) {
            return (key <= address && (uintptr_t)address < ((uintptr_t)key + value));
        });
    }